

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ScaleWindowsInViewport(ImGuiViewportP *viewport,float scale)

{
  ImGuiWindow **ppIVar1;
  int i;
  int i_00;
  ImVector<ImGuiWindow_*> *this;
  
  if (viewport->Window != (ImGuiWindow *)0x0) {
    ScaleWindow(viewport->Window,scale);
    return;
  }
  this = &GImGui->Windows;
  for (i_00 = 0; i_00 != this->Size; i_00 = i_00 + 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    if ((*ppIVar1)->Viewport == viewport) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
      ScaleWindow(*ppIVar1,scale);
    }
  }
  return;
}

Assistant:

void ImGui::ScaleWindowsInViewport(ImGuiViewportP* viewport, float scale)
{
    ImGuiContext& g = *GImGui;
    if (viewport->Window)
    {
        ScaleWindow(viewport->Window, scale);
    }
    else
    {
        for (int i = 0; i != g.Windows.Size; i++)
            if (g.Windows[i]->Viewport == viewport)
                ScaleWindow(g.Windows[i], scale);
    }
}